

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void __thiscall duckdb::UpdateSegment::UpdateSegment(UpdateSegment *this,ColumnData *column_data)

{
  PhysicalType type;
  idx_t iVar1;
  initialize_update_function_t p_Var2;
  fetch_update_function_t p_Var3;
  fetch_committed_function_t p_Var4;
  fetch_committed_range_function_t p_Var5;
  fetch_row_function_t p_Var6;
  merge_update_function_t p_Var7;
  rollback_update_function_t p_Var8;
  statistics_update_function_t p_Var9;
  long in_RSI;
  long *in_RDI;
  PhysicalType physical_type;
  Allocator *in_stack_ffffffffffffff38;
  LogicalType *in_stack_ffffffffffffff40;
  LogicalType *in_stack_ffffffffffffff68;
  SegmentStatistics *in_stack_ffffffffffffff70;
  
  *in_RDI = in_RSI;
  StorageLock::StorageLock((StorageLock *)0xba2300);
  unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::unique_ptr
            ((unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true> *)
             0xba2316);
  LogicalType::LogicalType(in_stack_ffffffffffffff40,(LogicalType *)in_stack_ffffffffffffff38);
  SegmentStatistics::SegmentStatistics(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  LogicalType::~LogicalType((LogicalType *)0xba2369);
  ::std::mutex::mutex((mutex *)0xba237a);
  ColumnData::GetDatabase((ColumnData *)0xba239a);
  BufferAllocator::Get((DatabaseInstance *)0xba23ab);
  StringHeap::StringHeap((StringHeap *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  type = LogicalType::InternalType((LogicalType *)(in_RSI + 0x30));
  iVar1 = GetTypeIdSize(type);
  in_RDI[0x14] = iVar1;
  p_Var2 = GetInitializeUpdateFunction(type);
  in_RDI[0x1e] = (long)p_Var2;
  p_Var3 = GetFetchUpdateFunction(type);
  in_RDI[0x20] = (long)p_Var3;
  p_Var4 = GetFetchCommittedFunction(type);
  in_RDI[0x21] = (long)p_Var4;
  p_Var5 = GetFetchCommittedRangeFunction(type);
  in_RDI[0x22] = (long)p_Var5;
  p_Var6 = GetFetchRowFunction(type);
  in_RDI[0x23] = (long)p_Var6;
  p_Var7 = GetMergeUpdateFunction(type);
  in_RDI[0x1f] = (long)p_Var7;
  p_Var8 = GetRollbackUpdateFunction(type);
  in_RDI[0x24] = (long)p_Var8;
  p_Var9 = GetStatisticsUpdateFunction(type);
  in_RDI[0x25] = (long)p_Var9;
  return;
}

Assistant:

UpdateSegment::UpdateSegment(ColumnData &column_data)
    : column_data(column_data), stats(column_data.type), heap(BufferAllocator::Get(column_data.GetDatabase())) {
	auto physical_type = column_data.type.InternalType();

	this->type_size = GetTypeIdSize(physical_type);

	this->initialize_update_function = GetInitializeUpdateFunction(physical_type);
	this->fetch_update_function = GetFetchUpdateFunction(physical_type);
	this->fetch_committed_function = GetFetchCommittedFunction(physical_type);
	this->fetch_committed_range = GetFetchCommittedRangeFunction(physical_type);
	this->fetch_row_function = GetFetchRowFunction(physical_type);
	this->merge_update_function = GetMergeUpdateFunction(physical_type);
	this->rollback_update_function = GetRollbackUpdateFunction(physical_type);
	this->statistics_update_function = GetStatisticsUpdateFunction(physical_type);
}